

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_hmac_prng.c
# Opt level: O0

int tc_hmac_prng_generate(uint8_t *out,uint outlen,TCHmacPrng_t prng)

{
  uint local_34;
  uint local_30;
  uint bufferlen;
  TCHmacPrng_t prng_local;
  EVP_PKEY_CTX *pEStack_18;
  uint outlen_local;
  uint8_t *out_local;
  
  if ((((out == (uint8_t *)0x0) || (prng == (TCHmacPrng_t)0x0)) || (outlen == 0)) ||
     (0x80000 < outlen)) {
    out_local._4_4_ = 0;
  }
  else if (prng->countdown == 0) {
    out_local._4_4_ = -1;
  }
  else {
    prng->countdown = prng->countdown - 1;
    prng_local._4_4_ = outlen;
    pEStack_18 = (EVP_PKEY_CTX *)out;
    while (prng_local._4_4_ != 0) {
      tc_hmac_init(&prng->h);
      tc_hmac_update(&prng->h,prng->v,0x20);
      tc_hmac_final(prng->v,0x20,&prng->h);
      if (prng_local._4_4_ < 0x20) {
        local_30 = prng_local._4_4_;
      }
      else {
        local_30 = 0x20;
      }
      _copy(pEStack_18,(EVP_PKEY_CTX *)(ulong)local_30);
      pEStack_18 = pEStack_18 + local_30;
      if (prng_local._4_4_ < 0x21) {
        local_34 = 0;
      }
      else {
        local_34 = prng_local._4_4_ - 0x20;
      }
      prng_local._4_4_ = local_34;
    }
    update(prng,prng->v,0x20);
    out_local._4_4_ = 1;
  }
  return out_local._4_4_;
}

Assistant:

int tc_hmac_prng_generate(uint8_t *out, unsigned int outlen, TCHmacPrng_t prng)
{
	unsigned int bufferlen;

	/* input sanity check: */
	if (out == (uint8_t *) 0 ||
	    prng == (TCHmacPrng_t) 0 ||
	    outlen == 0 ||
	    outlen > MAX_OUT) {
		return TC_CRYPTO_FAIL;
	} else if (prng->countdown == 0) {
		return TC_HMAC_PRNG_RESEED_REQ;
	}

	prng->countdown--;

	while (outlen != 0) {
		/* operate HMAC in OFB mode to create "random" outputs */
		(void)tc_hmac_init(&prng->h);
		(void)tc_hmac_update(&prng->h, prng->v, sizeof(prng->v));
		(void)tc_hmac_final(prng->v, sizeof(prng->v), &prng->h);

		bufferlen = (TC_SHA256_DIGEST_SIZE > outlen) ?
			outlen : TC_SHA256_DIGEST_SIZE;
		(void)_copy(out, bufferlen, prng->v, bufferlen);

		out += bufferlen;
		outlen = (outlen > TC_SHA256_DIGEST_SIZE) ?
			(outlen - TC_SHA256_DIGEST_SIZE) : 0;
	}

	/* block future PRNG compromises from revealing past state */
	update(prng, prng->v, TC_SHA256_DIGEST_SIZE);

	return TC_CRYPTO_SUCCESS;
}